

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Graph<Node>::Graph(Graph<Node> *this,int nodeCnt)

{
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  int *piVar4;
  size_t __size;
  void *__ptr;
  
  vector<NodeList<Node>_>::vector(&this->G);
  puVar3 = (undefined8 *)operator_new__(0x14);
  *puVar3 = 1;
  puVar3[1] = 0;
  *(undefined4 *)(puVar3 + 2) = 0;
  (this->edges).vect = (Edge *)(puVar3 + 1);
  (this->edges)._size = 0;
  (this->edges)._capacity = 1;
  vector<vector<int>_>::vector(&this->minDist);
  vector<vector<int>_>::vector(&this->nextNodeInPath);
  vector<vector<int>_>::vector(&this->compList);
  piVar4 = (int *)operator_new__(4);
  *piVar4 = 0;
  (this->inCC).vect = piVar4;
  (this->inCC)._size = 0;
  (this->inCC)._capacity = 1;
  this->_nodeCnt = nodeCnt;
  this->_edgeCnt = 0;
  uVar2 = 1;
  do {
    __ptr = (void *)(ulong)uVar2;
    bVar1 = (int)uVar2 < nodeCnt;
    uVar2 = uVar2 * 2;
  } while (bVar1);
  vector<NodeList<Node>_>::realloc(&this->G,__ptr,__size);
  (this->G)._size = nodeCnt;
  initializeRoyFloyd(this);
  return;
}

Assistant:

explicit Graph(int nodeCnt) {
        _nodeCnt = nodeCnt;
        _edgeCnt = 0;
        G.resize(nodeCnt);
        initializeRoyFloyd();
    }